

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvawatch.c
# Opt level: O3

void * t64watchfun(void *x)

{
  void *pvVar1;
  int iVar2;
  uint32_t uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  
  pvVar1 = nva_cards[cnum]->bar0;
  uVar3 = *(uint32_t *)((long)pvVar1 + (ulong)(uint)a);
  queue[put] = uVar3;
  iVar2 = *(int *)((long)pvVar1 + 0x9410);
  do {
    iVar4 = iVar2;
    iVar2 = *(int *)((long)pvVar1 + 0x9410);
  } while (iVar4 != *(int *)((long)pvVar1 + 0x9410));
  tqueue64[put] = CONCAT44(iVar4,*(undefined4 *)((long)pvVar1 + 0x9400));
  uVar6 = put + 0x100000;
  if (-1 < (int)(put + 1U)) {
    uVar6 = put + 1U;
  }
  put = (put - (uVar6 & 0xfff00000)) + 1;
  do {
    do {
      uVar6 = *(uint *)((long)pvVar1 + (ulong)(uint)a);
      uVar5 = uVar3 ^ uVar6;
      uVar3 = uVar6;
    } while ((uVar5 & mask) == 0);
    queue[put] = uVar6;
    iVar2 = *(int *)((long)pvVar1 + 0x9410);
    do {
      iVar4 = iVar2;
      iVar2 = *(int *)((long)pvVar1 + 0x9410);
    } while (iVar4 != *(int *)((long)pvVar1 + 0x9410));
    tqueue64[put] = CONCAT44(iVar4,*(undefined4 *)((long)pvVar1 + 0x9400));
    uVar6 = put + 0x100000;
    if (-1 < (int)(put + 1U)) {
      uVar6 = put + 1U;
    }
    put = (put - (uVar6 & 0xfff00000)) + 1;
  } while( true );
}

Assistant:

void *t64watchfun(void *x) {
	uint32_t val = nva_rd32(cnum, a);
	queue[put] = val;
	tqueue64[put] = get_time(cnum);
	put = (put + 1) % SZ;
	while (1) {
		uint32_t nval = nva_rd32(cnum, a);
		if ((nval & mask) != (val & mask)) {
			queue[put] = nval;
			tqueue64[put] = get_time(cnum);
			put = (put + 1) % SZ;
		}
		val = nval;
	}
}